

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  pointer pnVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  Dring *pDVar12;
  int *piVar13;
  cpp_dec_float<200U,_int,_void> *v;
  cpp_dec_float<200U,_int,_void> *this_00;
  long lVar14;
  
  pCVar1 = &(this->u).col;
  piVar4 = (this->u).col.idx;
  pnVar5 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->u).col.len;
  piVar9 = (this->u).col.max;
  piVar7 = (this->u).col.start;
  iVar11 = 0;
  pDVar12 = &pCVar1->list;
  while (pDVar12 = ((Dring *)&pDVar12->next)->next, (Col *)pDVar12 != pCVar1) {
    iVar2 = pDVar12->idx;
    if (piVar7[iVar2] != iVar11) goto LAB_003f421f;
    iVar3 = piVar6[iVar2];
    iVar11 = iVar11 + iVar3;
    piVar9[iVar2] = iVar3;
  }
LAB_003f42bd:
  (this->u).col.used = iVar11;
  piVar9[this->thedim] = 0;
  return;
LAB_003f421f:
  do {
    iVar2 = pDVar12->idx;
    lVar14 = (long)piVar7[iVar2];
    piVar7[iVar2] = iVar11;
    iVar3 = piVar6[iVar2];
    piVar9[iVar2] = iVar3;
    lVar10 = iVar3 + lVar14;
    piVar13 = piVar4 + iVar11;
    this_00 = &pnVar5[iVar11].m_backend;
    v = (cpp_dec_float<200U,_int,_void> *)(lVar14 << 7);
    pnVar8 = pnVar5;
    for (; v = (cpp_dec_float<200U,_int,_void> *)((long)(v->data)._M_elems + (long)pnVar8),
        lVar14 < lVar10; lVar14 = lVar14 + 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,v);
      *piVar13 = piVar4[lVar14];
      iVar11 = iVar11 + 1;
      pnVar8 = (pointer)0x80;
      this_00 = this_00 + 1;
      piVar13 = piVar13 + 1;
    }
    pDVar12 = pDVar12->next;
  } while ((Col *)pDVar12 != pCVar1);
  piVar9 = (this->u).col.max;
  goto LAB_003f42bd;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}